

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int s_mp_mul_digs(mp_int *a,mp_int *b,mp_int *c,int digs)

{
  ulong uVar1;
  mp_digit *pmVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  mp_digit *pmVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  mp_int t;
  mp_int t_1;
  mp_int local_68;
  mp_int local_48;
  
  if (digs < 0x200) {
    iVar8 = b->used;
    if (a->used < b->used) {
      iVar8 = a->used;
    }
    if (iVar8 < 0x100) {
      iVar8 = fast_s_mp_mul_digs(a,b,c,digs);
      return iVar8;
    }
  }
  iVar8 = mp_init_size(&local_68,digs);
  if (iVar8 == 0) {
    local_68.used = digs;
    uVar9 = (ulong)(uint)a->used;
    if (a->used < 1) {
      uVar9 = 0;
    }
    pmVar12 = local_68.dp;
    iVar8 = digs;
    for (uVar13 = 0; uVar13 != uVar9; uVar13 = uVar13 + 1) {
      uVar1 = a->dp[uVar13];
      pmVar2 = b->dp;
      iVar14 = b->used;
      if (iVar8 <= b->used) {
        iVar14 = iVar8;
      }
      if (iVar14 < 1) {
        iVar14 = 0;
      }
      uVar11 = 0;
      for (lVar10 = 0; iVar14 != (int)lVar10; lVar10 = lVar10 + 1) {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar1;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = pmVar2[lVar10];
        auVar5[8] = CARRY8(uVar11,pmVar12[lVar10]);
        auVar5._0_8_ = uVar11 + pmVar12[lVar10];
        auVar5._9_7_ = 0;
        auVar5 = auVar3 * auVar4 + auVar5;
        uVar15 = auVar5._0_8_;
        uVar11 = auVar5._8_8_ << 4 | uVar15 >> 0x3c;
        pmVar12[lVar10] = uVar15 & 0xfffffffffffffff;
      }
      if (iVar14 + (int)uVar13 < digs) {
        pmVar12[lVar10] = uVar11;
      }
      iVar8 = iVar8 + -1;
      pmVar12 = pmVar12 + 1;
    }
    mp_clamp(&local_68);
    local_48.dp = local_68.dp;
    local_48.used = local_68.used;
    local_48.alloc = local_68.alloc;
    local_48.sign = local_68.sign;
    local_48._12_4_ = local_68._12_4_;
    pmVar12 = c->dp;
    uVar6._0_4_ = c->used;
    uVar6._4_4_ = c->alloc;
    uVar7._0_4_ = c->sign;
    uVar7._4_4_ = *(undefined4 *)&c->field_0xc;
    c->used = local_68.used;
    c->alloc = local_68.alloc;
    c->sign = local_68.sign;
    *(undefined4 *)&c->field_0xc = local_68._12_4_;
    c->dp = local_68.dp;
    local_68._0_8_ = uVar6;
    local_68._8_8_ = uVar7;
    local_68.dp = pmVar12;
    mp_clear(&local_68);
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int s_mp_mul_digs (mp_int * a, mp_int * b, mp_int * c, int digs)
{
  mp_int  t;
  int     res, pa, pb, ix, iy;
  mp_digit u;
  mp_word r;
  mp_digit tmpx, *tmpt, *tmpy;

  /* can we use the fast multiplier? */
  if (((digs) < MP_WARRAY) &&
      MIN (a->used, b->used) < 
          (1 << ((CHAR_BIT * sizeof (mp_word)) - (2 * DIGIT_BIT)))) {
    return fast_s_mp_mul_digs (a, b, c, digs);
  }

  if ((res = mp_init_size (&t, digs)) != MP_OKAY) {
    return res;
  }
  t.used = digs;

  /* compute the digits of the product directly */
  pa = a->used;
  for (ix = 0; ix < pa; ix++) {
    /* set the carry to zero */
    u = 0;

    /* limit ourselves to making digs digits of output */
    pb = MIN (b->used, digs - ix);

    /* setup some aliases */
    /* copy of the digit from a used within the nested loop */
    tmpx = a->dp[ix];
    
    /* an alias for the destination shifted ix places */
    tmpt = t.dp + ix;
    
    /* an alias for the digits of b */
    tmpy = b->dp;

    /* compute the columns of the output and propagate the carry */
    for (iy = 0; iy < pb; iy++) {
      /* compute the column as a mp_word */
      r       = ((mp_word)*tmpt) +
                ((mp_word)tmpx) * ((mp_word)*tmpy++) +
                ((mp_word) u);

      /* the new column is the lower part of the result */
      *tmpt++ = (mp_digit) (r & ((mp_word) MP_MASK));

      /* get the carry word from the result */
      u       = (mp_digit) (r >> ((mp_word) DIGIT_BIT));
    }
    /* set carry if it is placed below digs */
    if (ix + iy < digs) {
      *tmpt = u;
    }
  }

  mp_clamp (&t);
  mp_exch (&t, c);

  mp_clear (&t);
  return MP_OKAY;
}